

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRationalBezierCurve::~IfcRationalBezierCurve
          (IfcRationalBezierCurve *this,void **vtt)

{
  void **vtt_local;
  IfcRationalBezierCurve *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)) = vtt[0x2a];
  *(void **)&this->field_0x10 = vtt[0x2b];
  *(void **)&this->field_0x20 = vtt[0x2c];
  *(void **)&this->field_0x30 = vtt[0x2d];
  *(void **)&this->field_0x40 = vtt[0x2e];
  *(void **)&this->field_0xb0 = vtt[0x2f];
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
  _vptr_ObjectHelper = (_func_int **)vtt[0x30];
  STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_0UL>::~ListOf
            ((ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_0UL> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
              field_0x10);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>::~ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>,
             vtt + 0x28);
  IfcBezierCurve::~IfcBezierCurve((IfcBezierCurve *)this,vtt + 1);
  return;
}

Assistant:

IfcRationalBezierCurve() : Object("IfcRationalBezierCurve") {}